

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnBrExpr(BinaryReaderInterp *this,Index depth)

{
  Result RVar1;
  Enum EVar2;
  Index keep_count;
  Index drop_count;
  Location local_98;
  Var local_70;
  
  RVar1 = GetBrDropKeepCount(this,depth,&drop_count,&keep_count);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    local_98.field_1.field_0.line = 0;
    local_98.field_1._4_8_ = 0;
    local_98.filename.data_ = (char *)0x0;
    local_98.filename.size_._0_4_ = 0;
    local_98.filename.size_._4_4_ = 0;
    Var::Var(&local_70,depth,&local_98);
    RVar1 = SharedValidator::OnBr
                      (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                       &local_70);
    Var::~Var(&local_70);
    if (RVar1.enum_ != Error) {
      EmitBr(this,depth,drop_count,keep_count);
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnBrExpr(Index depth) {
  Index drop_count, keep_count;
  CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
  CHECK_RESULT(validator_.OnBr(loc, Var(depth)));
  EmitBr(depth, drop_count, keep_count);
  return Result::Ok;
}